

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall tinyusdz::crate::CrateReader::ReadTOC(CrateReader *this)

{
  ostringstream *poVar1;
  StreamReader *this_00;
  pointer pSVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  unsigned_long *in_R8;
  uint64_t num_sections;
  ostringstream ss_e;
  string local_208;
  pointer local_1e8;
  string local_1e0;
  string *local_1c0;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  uVar9 = this->_toc_offset;
  if ((long)uVar9 < 0x59) {
LAB_001d4ac7:
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    ::std::__cxx11::ostringstream::ostringstream(poVar1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ReadTOC",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
    poVar8 = (ostream *)::std::ostream::operator<<(poVar1,0x1873);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    pcVar11 = "Invalid toc offset.";
    lVar10 = 0x13;
LAB_001d4b65:
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),pcVar11,lVar10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_208._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p == &local_208.field_2) goto LAB_001d4bc1;
  }
  else {
    this_00 = this->_sr;
    if ((long)this_00->length_ <= (long)uVar9) goto LAB_001d4ac7;
    if (this_00->length_ < uVar9) {
      poVar1 = (ostringstream *)(local_1b8 + 0x10);
      ::std::__cxx11::ostringstream::ostringstream(poVar1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ReadTOC",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
      poVar8 = (ostream *)::std::ostream::operator<<(poVar1,0x1878);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      pcVar11 = "Failed to move to TOC offset.";
LAB_001d4abd:
      lVar10 = 0x1d;
      goto LAB_001d4b65;
    }
    this_00->idx_ = uVar9;
    local_1b8._0_8_ = (pointer)0x0;
    bVar5 = StreamReader::read8(this_00,(uint64_t *)local_1b8);
    if (!bVar5) {
      poVar1 = (ostringstream *)(local_1b8 + 0x10);
      ::std::__cxx11::ostringstream::ostringstream(poVar1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ReadTOC",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
      poVar8 = (ostream *)::std::ostream::operator<<(poVar1,0x187f);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      pcVar11 = "Failed to read TOC(# of sections).";
      lVar10 = 0x22;
      goto LAB_001d4b65;
    }
    if ((ulong)local_1b8._0_8_ < (pointer)(this->_config).maxTOCSections) {
      local_1b8._8_8_ = &this->_toc;
      ::std::vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::resize
                ((vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_> *)
                 local_1b8._8_8_,local_1b8._0_8_);
      uVar9 = local_1b8._0_8_ * 0x20 + this->_memoryUsage;
      this->_memoryUsage = uVar9;
      if (uVar9 <= (this->_config).maxMemoryBudget) {
        bVar5 = (pointer)local_1b8._0_8_ == (pointer)0x0;
        if (bVar5) {
          return bVar5;
        }
        local_1c0 = &this->_err;
        lVar10 = 0;
        local_1e8 = (pointer)0x0;
        while( true ) {
          bVar6 = ReadSection(this,(Section *)
                                   (((this->_toc).sections.
                                     super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->name + lVar10));
          if (!bVar6) {
            poVar1 = (ostringstream *)(local_1b8 + 0x10);
            ::std::__cxx11::ostringstream::ostringstream(poVar1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ReadTOC",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<(poVar1,0x188e);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            ::std::__cxx11::to_string(&local_1e0,(unsigned_long)local_1e8);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_208,"Failed to read TOC section at ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1e0);
            goto LAB_001d5620;
          }
          pSVar2 = (((vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_> *)
                    local_1b8._8_8_)->
                   super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar9 = *(ulong *)(pSVar2->name + lVar10 + 0x10);
          if ((long)uVar9 < 0) break;
          uVar3 = *(ulong *)(pSVar2->name + lVar10 + 0x18);
          if ((long)uVar3 < 1) {
            poVar1 = (ostringstream *)(local_1b8 + 0x10);
            ::std::__cxx11::ostringstream::ostringstream(poVar1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ReadTOC",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<(poVar1,0x189a);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            pcVar12 = "Invalid or empty section size.";
            pcVar11 = "";
            goto LAB_001d560a;
          }
          uVar4 = this->_sr->length_;
          if (uVar4 < uVar3) {
            poVar1 = (ostringstream *)(local_1b8 + 0x10);
            ::std::__cxx11::ostringstream::ostringstream(poVar1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ReadTOC",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<(poVar1,0x189e);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            pcVar12 = "Section size exceeds input USDC data size.";
            pcVar11 = "";
            goto LAB_001d560a;
          }
          if (uVar4 < uVar9) {
            poVar1 = (ostringstream *)(local_1b8 + 0x10);
            ::std::__cxx11::ostringstream::ostringstream(poVar1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ReadTOC",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<(poVar1,0x18a2);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            pcVar12 = "Section start byte offset exceeds input USDC data size.";
            pcVar11 = "";
            goto LAB_001d560a;
          }
          if (uVar4 < uVar3 + uVar9) {
            poVar1 = (ostringstream *)(local_1b8 + 0x10);
            ::std::__cxx11::ostringstream::ostringstream(poVar1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ReadTOC",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<(poVar1,0x18ad);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1e0,
                       "Section byte offset + size exceeds input USDC data size.","");
            fmt::format(&local_208,&local_1e0);
            poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)poVar1,local_208._M_dataplus._M_p,
                                local_208._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)local_1c0,(ulong)local_208._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 0x10));
            ::std::ios_base::~ios_base(local_138);
          }
          else {
            pcVar11 = pSVar2->name + lVar10;
            iVar7 = strncmp(pcVar11,"TOKENS",0xf);
            if (iVar7 == 0) {
              this->_tokens_index = (int64_t)local_1e8;
            }
            else {
              iVar7 = strncmp(pcVar11,"STRINGS",0xf);
              if (iVar7 == 0) {
                this->_strings_index = (int64_t)local_1e8;
              }
              else {
                iVar7 = strncmp(pcVar11,"FIELDS",0xf);
                if (iVar7 == 0) {
                  this->_fields_index = (int64_t)local_1e8;
                }
                else {
                  iVar7 = strncmp(pcVar11,"FIELDSETS",0xf);
                  if (iVar7 == 0) {
                    this->_fieldsets_index = (int64_t)local_1e8;
                  }
                  else {
                    iVar7 = strncmp(pcVar11,"SPECS",0xf);
                    if (iVar7 == 0) {
                      this->_specs_index = (int64_t)local_1e8;
                    }
                    else {
                      iVar7 = strncmp(pcVar11,"PATHS",0xf);
                      if (iVar7 == 0) {
                        this->_paths_index = (int64_t)local_1e8;
                      }
                    }
                  }
                }
              }
            }
          }
          if (uVar4 < uVar3 + uVar9) {
            return bVar5;
          }
          local_1e8 = local_1e8 + 1;
          lVar10 = lVar10 + 0x20;
          bVar5 = (ulong)local_1b8._0_8_ <= local_1e8;
          if (bVar5) {
            return bVar5;
          }
        }
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        ::std::__cxx11::ostringstream::ostringstream(poVar1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ReadTOC",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
        poVar8 = (ostream *)::std::ostream::operator<<(poVar1,0x1896);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        pcVar12 = "Invalid section start byte offset.";
        pcVar11 = "";
LAB_001d560a:
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar12,pcVar11);
        fmt::format(&local_208,&local_1e0);
LAB_001d5620:
        poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)(local_1b8 + 0x10),local_208._M_dataplus._M_p,
                            local_208._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)local_1c0,(ulong)local_208._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 0x10));
        ::std::ios_base::~ios_base(local_138);
        return bVar5;
      }
      poVar1 = (ostringstream *)(local_1b8 + 0x10);
      ::std::__cxx11::ostringstream::ostringstream(poVar1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ReadTOC",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
      poVar8 = (ostream *)::std::ostream::operator<<(poVar1,0x188a);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      pcVar11 = "Reached to max memory budget.";
      goto LAB_001d4abd;
    }
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    ::std::__cxx11::ostringstream::ostringstream(poVar1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ReadTOC",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
    poVar8 = (ostream *)::std::ostream::operator<<(poVar1,0x1883);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e0,"# of sections {} are too large. maxTOCSections is set to {}",""
              );
    fmt::format<unsigned_long,unsigned_long>
              (&local_208,(fmt *)&local_1e0,(string *)local_1b8,&(this->_config).maxTOCSections,
               in_R8);
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,local_208._M_dataplus._M_p,local_208._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_208._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p == &local_208.field_2) goto LAB_001d4bc1;
  }
  operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
LAB_001d4bc1:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 0x10));
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool CrateReader::ReadTOC() {

  DCOUT(fmt::format("Memory budget: {} bytes", _config.maxMemoryBudget));

  if ((_toc_offset <= 88) || (_toc_offset >= int64_t(_sr->size()))) {
    PUSH_ERROR("Invalid toc offset.");
    return false;
  }

  if (!_sr->seek_set(uint64_t(_toc_offset))) {
    PUSH_ERROR("Failed to move to TOC offset.");
    return false;
  }

  // read # of sections.
  uint64_t num_sections{0};
  if (!_sr->read8(&num_sections)) {
    PUSH_ERROR("Failed to read TOC(# of sections).");
    return false;
  }
  if (num_sections >= _config.maxTOCSections) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("# of sections {} are too large. maxTOCSections is set to {}", num_sections, _config.maxTOCSections));
  }

  DCOUT("toc sections = " << num_sections);

  _toc.sections.resize(static_cast<size_t>(num_sections));

  CHECK_MEMORY_USAGE(num_sections * sizeof(Section));

  for (size_t i = 0; i < num_sections; i++) {
    if (!ReadSection(&_toc.sections[i])) {
      PUSH_ERROR("Failed to read TOC section at " + std::to_string(i));
      return false;
    }
    DCOUT("section[" << i << "] name = " << _toc.sections[i].name
                     << ", start = " << _toc.sections[i].start
                     << ", size = " << _toc.sections[i].size);

    if (_toc.sections[i].start < 0) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Invalid section start byte offset."));
    }

    if (_toc.sections[i].size <= 0) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Invalid or empty section size."));
    }

    if (size_t(_toc.sections[i].size) > _sr->size()) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Section size exceeds input USDC data size."));
    }

    if (size_t(_toc.sections[i].start) > _sr->size()) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Section start byte offset exceeds input USDC data size."));
    }

    // TODO: handle integer overflow.
    size_t end_offset = size_t(_toc.sections[i].start + _toc.sections[i].size);
    if (sizeof(void *) == 4) { // 32bit
      if (end_offset > size_t(std::numeric_limits<int32_t>::max())) {
        PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Section end offset exceeds 32bit max."));
      }
    }
    if (end_offset > _sr->size()) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Section byte offset + size exceeds input USDC data size."));
    }


    if (0 == strncmp(_toc.sections[i].name, "TOKENS",
                     crate::kSectionNameMaxLength)) {
      _tokens_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "STRINGS",
                            crate::kSectionNameMaxLength)) {
      _strings_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "FIELDS",
                            crate::kSectionNameMaxLength)) {
      _fields_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "FIELDSETS",
                            crate::kSectionNameMaxLength)) {
      _fieldsets_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "SPECS",
                            crate::kSectionNameMaxLength)) {
      _specs_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "PATHS",
                            crate::kSectionNameMaxLength)) {
      _paths_index = int64_t(i);
    }
  }

  DCOUT("TOC read success");
  return true;
}